

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O3

void __thiscall
MODEL3D::three_dim_model::clipper_paths_to_gds
          (three_dim_model *this,Paths *target_paths,string *gds_name,int *layer_number)

{
  pointer pvVar1;
  pointer pcVar2;
  long *plVar3;
  pointer *__n;
  pointer corX;
  undefined1 this_00 [8];
  pointer in_path;
  vector<co_ord,_std::allocator<co_ord>_> polygons;
  co_ord p_hold_poly;
  gdsSTR main;
  gdscpp my_polygons;
  vector<co_ord,_std::allocator<co_ord>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [8];
  pointer piStack_340;
  pointer local_338;
  pointer piStack_330;
  pointer local_328;
  pointer piStack_320;
  undefined1 local_2d8 [32];
  _Base_ptr local_2b8;
  size_t sStack_2b0;
  int local_2a8;
  undefined1 local_2a0 [24];
  vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_> local_288 [7];
  gdscpp local_1e0;
  gdsSTR local_120;
  
  gdscpp::gdscpp(&local_1e0);
  local_2d8._0_8_ = local_2d8 + 0x10;
  local_2d8._8_8_ = 0;
  local_2d8[0x10] = '\0';
  local_2b8 = (_Base_ptr)0x0;
  sStack_2b0 = 0;
  local_2a8 = 0;
  memset(local_2a0,0,0xc0);
  this_00 = (undefined1  [8])local_2d8;
  std::__cxx11::string::_M_assign((string *)this_00);
  local_388.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_388.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_388.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  in_path = (target_paths->
            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (target_paths->
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (in_path != pvVar1) {
    do {
      local_328 = (pointer)0x0;
      piStack_320 = (pointer)0x0;
      local_338 = (pointer)0x0;
      piStack_330 = (pointer)0x0;
      local_348 = (undefined1  [8])0x0;
      piStack_340 = (pointer)0x0;
      path_to_co_ord((three_dim_model *)this_00,in_path,(co_ord *)local_348);
      std::vector<co_ord,_std::allocator<co_ord>_>::push_back(&local_388,(co_ord *)local_348);
      if (piStack_330 != (pointer)0x0) {
        operator_delete(piStack_330,(long)piStack_320 - (long)piStack_330);
      }
      this_00 = local_348;
      if (local_348 != (undefined1  [8])0x0) {
        operator_delete((void *)local_348,(long)local_338 - (long)local_348);
      }
      pcVar2 = local_388.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.
               super__Vector_impl_data._M_finish;
      in_path = in_path + 1;
    } while (in_path != pvVar1);
    if (local_388.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_388.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      corX = local_388.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.
             super__Vector_impl_data._M_start;
      do {
        drawBoundary((gdsBOUNDARY *)local_348,*layer_number,&corX->x,&corX->y);
        std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::emplace_back<gdsBOUNDARY>
                  (local_288,(gdsBOUNDARY *)local_348);
        gdsBOUNDARY::~gdsBOUNDARY((gdsBOUNDARY *)local_348);
        corX = corX + 1;
      } while (corX != pcVar2);
    }
  }
  gdsSTR::gdsSTR(&local_120,(gdsSTR *)local_2d8);
  gdscpp::setSTR(&local_1e0,&local_120);
  gdsSTR::~gdsSTR(&local_120);
  std::operator+(&local_368,"data/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_368);
  __n = (pointer *)(plVar3 + 2);
  if ((pointer *)*plVar3 == __n) {
    local_338 = *__n;
    piStack_330 = (pointer)plVar3[3];
    local_348 = (undefined1  [8])&local_338;
  }
  else {
    local_338 = *__n;
    local_348 = (undefined1  [8])*plVar3;
  }
  piStack_340 = (pointer)plVar3[1];
  *plVar3 = (long)__n;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  gdscpp::write(&local_1e0,(int)local_348,piStack_340,(size_t)__n);
  if (local_348 != (undefined1  [8])&local_338) {
    operator_delete((void *)local_348,(long)local_338 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  std::vector<co_ord,_std::allocator<co_ord>_>::~vector(&local_388);
  gdsSTR::~gdsSTR((gdsSTR *)local_2d8);
  gdscpp::~gdscpp(&local_1e0);
  return;
}

Assistant:

void MODEL3D::three_dim_model::clipper_paths_to_gds(    const ClipperLib::Paths &target_paths,
                                                        const std::string &gds_name,
                                                        const int &layer_number )
{
    gdscpp my_polygons;
    gdsSTR main;
    main.name = gds_name;
    std::vector<co_ord> polygons;
    auto paths_it_end = target_paths.end();
    for (auto path_it = target_paths.begin(); path_it != paths_it_end; path_it++)
    {
        co_ord p_hold_poly;
        path_to_co_ord(*path_it, p_hold_poly);
        polygons.push_back(p_hold_poly);
    }
    auto polygons_it_end = polygons.end();
    for (auto polygon_it = polygons.begin(); polygon_it != polygons_it_end; polygon_it++)
    {
        main.BOUNDARY.push_back(drawBoundary( layer_number , polygon_it->x, polygon_it->y));
    }
    my_polygons.setSTR(main);
    my_polygons.write("data/"+main.name+".gds");
}